

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

void out_token(Token *token)

{
  char *local_18;
  char *s;
  Token *token_local;
  
  local_18 = token->text;
  if (token->kind == NEWLINE) {
    local_18 = "<New Line>";
  }
  print("<Kind=%s<%d>, (%d,%d)>",local_18,(ulong)token->kind,(ulong)token->row_pos,
        (ulong)token->col_pos);
  return;
}

Assistant:

void out_token(Token *token) {
    char *s = token->text;
    if (token->kind == NEWLINE) {
        s = "<New Line>";
    }
    print("<Kind=%s<%d>, (%d,%d)>",
          s,
          token->kind,
          token->row_pos,
          token->col_pos);
}